

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

CNode * __thiscall
CConnman::ConnectNode
          (CConnman *this,CAddress addrConnect,char *pszDest,bool fCountFailure,
          ConnectionType conn_type,bool use_v2transport)

{
  Mutex *mutexIn;
  atomic<long> *paVar1;
  uint64_t data;
  long lVar2;
  Session *this_00;
  _Elt_pointer puVar3;
  __uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true> _Var4;
  AddrMan *this_01;
  DNSLookupFn dns_lookup_function;
  CService ipIn;
  CService ipIn_00;
  unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> uVar5;
  pointer pCVar6;
  undefined8 __last;
  bool bVar7;
  uint16_t portDefault;
  uint16_t uVar8;
  Network net;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar9;
  RecursiveMutex *mutexIn_00;
  CNode *pCVar10;
  CThreadInterrupt *pCVar11;
  size_type sVar12;
  CSipHasher *this_02;
  uint64_t nKeyedNetGroupIn;
  CNode *this_03;
  CAddress *addrIn;
  uint16_t port_00;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> address;
  char *pcVar13;
  int iVar14;
  undefined7 in_register_00000081;
  uint32_t in_R9D;
  undefined8 uVar15;
  _Head_base<0UL,_Sock_*,_false> _Var16;
  char (*args) [3];
  _Head_base<0UL,_Sock_*,_false> sock;
  long in_FS_OFFSET;
  double dVar17;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view in;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  shared_ptr<Sock> sock_00;
  string_view source_file_03;
  CNodeOptions *node_opts;
  undefined6 in_stack_fffffffffffffd48;
  CConnman *pCVar18;
  undefined8 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>
  *this_04;
  undefined1 local_268 [16];
  uint16_t port;
  undefined6 uStack_256;
  undefined8 uStack_250;
  pointer local_248;
  NetPermissionFlags permission_flags;
  bool proxyConnectionFailed;
  unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> i2p_transient_session;
  undefined1 local_220 [8];
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_218;
  vector<CAddress,_std::allocator<CAddress>_> local_1f8;
  allocator<char> local_1d9;
  char *pszDest_local;
  CService local_1d0;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock28;
  CAddress addr_bind;
  Proxy proxy;
  CService local_e8;
  Connection conn;
  
  pszDest_local = (char *)CONCAT71(in_register_00000011,fCountFailure);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar14 = (int)(string *)CONCAT71(in_register_00000081,use_v2transport);
  if (iVar14 == 0) {
    __assert_fail("conn_type != ConnectionType::INBOUND",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                  ,0x187,
                  "CNode *CConnman::ConnectNode(CAddress, const char *, bool, ConnectionType, bool)"
                 );
  }
  if (pszDest_local == (char *)0x0) {
    bVar7 = IsLocal((CService *)pszDest);
    if (!bVar7) {
      CService::CService((CService *)&conn,(CService *)pszDest);
      pCVar10 = FindNode(this,(CService *)&conn);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&conn);
      if (pCVar10 == (CNode *)0x0) goto LAB_00175ae6;
      logging_function._M_str = "ConnectNode";
      logging_function._M_len = 0xb;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x191,ALL,Info,(ConstevalFormatString<0U>)0x686f2a);
    }
    pCVar10 = (CNode *)0x0;
    goto LAB_001766e9;
  }
LAB_00175ae6:
  bVar7 = ::LogAcceptCategory(NET,Debug);
  if (bVar7) {
    args = (char (*) [3])0x67fb0b;
    if ((char)in_R9D != '\0') {
      args = (char (*) [3])0x67e10d;
    }
    if (pszDest_local == (char *)0x0) {
      CService::ToStringAddrPort_abi_cxx11_((string *)&conn,(CService *)pszDest);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&conn,pszDest_local,&local_1d9);
    }
    dVar17 = 0.0;
    if (pszDest_local == (char *)0x0) {
      tVar9 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ();
      dVar17 = (double)((long)tVar9.__d.__r - *(long *)(pszDest + 0x28));
    }
    proxy.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)(dVar17 / 3600.0);
    logging_function_00._M_str = "ConnectNode";
    logging_function_00._M_len = 0xb;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file_00._M_len = 0x57;
    LogPrintFormatInternal<char[3],std::__cxx11::string,double>
              (logging_function_00,source_file_00,0x199,NET,Debug,
               (ConstevalFormatString<3U>)0x686f5c,args,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&conn,
               (double *)&proxy);
    std::__cxx11::string::~string((string *)&conn);
  }
  if (pszDest_local == (char *)0x0) {
    portDefault = this->m_params->nDefaultPort;
    pcVar13 = (char *)0x0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&conn,pszDest_local,(allocator<char> *)&proxy);
    portDefault = GetDefaultPort(this,(string *)&conn);
    std::__cxx11::string::~string((string *)&conn);
    pcVar13 = pszDest_local;
  }
  local_1f8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (CAddress *)0x0;
  local_1f8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (CAddress *)0x0;
  if (pcVar13 == (char *)0x0) {
    std::vector<CAddress,_std::allocator<CAddress>_>::push_back(&local_1f8,(value_type *)pszDest);
LAB_00175f20:
    local_220 = (undefined1  [8])0x0;
    Proxy::Proxy(&proxy);
    CAddress::CAddress(&addr_bind);
    bVar7 = CNetAddr::IsValid((CNetAddr *)&addr_bind);
    pCVar6 = local_1f8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (bVar7) {
      __assert_fail("!addr_bind.IsValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                    ,0x1c5,
                    "CNode *CConnman::ConnectNode(CAddress, const char *, bool, ConnectionType, bool)"
                   );
    }
    mutexIn = &this->m_unused_i2p_sessions_mutex;
    i2p_transient_session._M_t.
    super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t.
    super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
    super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
         (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
         (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
    this_04 = (deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>
               *)&this->m_unused_i2p_sessions;
    pCVar11 = &this->interruptNet;
    pCVar10 = (CNode *)0x0;
    sock._M_head_impl = (Sock *)0x0;
    for (address._M_pi =
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_1f8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_start; (pointer)address._M_pi != pCVar6;
        address._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&address._M_pi[3]._M_use_count) {
      bVar7 = CNetAddr::IsValid((CNetAddr *)address._M_pi);
      port_00 = (uint16_t)&conn;
      if (bVar7) {
        net = CNetAddr::GetNetwork((CNetAddr *)address._M_pi);
        bVar7 = GetProxy(net,&proxy);
        proxyConnectionFailed = false;
        if (bVar7 && address._M_pi[1]._M_use_count == 4) {
          i2p::Connection::Connection(&conn);
          this_00 = (this->m_i2p_sam_session)._M_t.
                    super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                    .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
          if (this_00 == (Session *)0x0) {
            UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                      (&criticalblock28,mutexIn,"m_unused_i2p_sessions_mutex",
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                       ,0x1d5,false);
            puVar3 = (this->m_unused_i2p_sessions).c.
                     super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            if ((this->m_unused_i2p_sessions).c.
                super__Deque_base<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar3) {
              _permission_flags = pCVar11;
              std::make_unique<i2p::sam::Session,Proxy&,CThreadInterrupt*>
                        ((Proxy *)&port,(CThreadInterrupt **)&proxy);
              uVar15 = _port;
              _port = (pointer)0x0;
              std::__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::
              reset((__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                    &i2p_transient_session,(pointer)uVar15);
              std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::
              ~unique_ptr((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                          &port);
            }
            else {
              _Var4.
              super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t
              .super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
              super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                   (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)
                   (puVar3->_M_t).
                   super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                   .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
              (puVar3->_M_t).
              super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t
              .super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
              super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                   (Session *)
                   i2p_transient_session._M_t.
                   super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                   .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
              i2p_transient_session._M_t.
              super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t
              .super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
              super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                   (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                    )(__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                      )_Var4.
                       super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                       .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
              std::
              deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
              ::pop_front((deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                           *)this_04);
            }
            std::unique_lock<std::mutex>::~unique_lock(&criticalblock28.super_unique_lock);
            bVar7 = i2p::sam::Session::Connect
                              ((Session *)
                               i2p_transient_session._M_t.
                               super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                               .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl,
                               (CService *)address._M_pi,&conn,&proxyConnectionFailed);
            if (!bVar7) {
              UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                        (&criticalblock28,mutexIn,"m_unused_i2p_sessions_mutex",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                         ,0x1e0,false);
              sVar12 = std::
                       deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                       ::size((deque<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>,_std::allocator<std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>_>_>
                               *)this_04);
              uVar5 = i2p_transient_session;
              if (sVar12 < 10) {
                i2p_transient_session._M_t.
                super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
                _M_t.
                super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
                     (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                      )(__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)
                       0x0;
                _port = uVar5._M_t.
                        super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                        .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
                std::
                deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>
                ::emplace_back<i2p::sam::Session*>(this_04,(Session **)&port);
              }
              std::unique_lock<std::mutex>::~unique_lock(&criticalblock28.super_unique_lock);
              goto LAB_001763cb;
            }
LAB_001762f5:
            _Var16._M_head_impl =
                 (Sock *)conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t
                         .super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                         super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
            conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
            super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
            super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
                 (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                 (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0;
            local_220 = (undefined1  [8])_Var16._M_head_impl;
            CService::CService(&local_1d0,&conn.me);
            ipIn_00.super_CNetAddr.m_addr._union._6_2_ = portDefault;
            ipIn_00.super_CNetAddr.m_addr._union._0_6_ = in_stack_fffffffffffffd48;
            ipIn_00.super_CNetAddr.m_addr._union._8_8_ = this;
            ipIn_00.super_CNetAddr.m_addr._16_8_ = pCVar10;
            ipIn_00.super_CNetAddr.m_net = in_stack_fffffffffffffd60;
            ipIn_00.super_CNetAddr.m_scope_id = in_R9D;
            ipIn_00._32_8_ = this_04;
            CAddress::CAddress((CAddress *)&criticalblock28,ipIn_00,(ServiceFlags)&local_1d0);
            CAddress::operator=(&addr_bind,(CAddress *)&criticalblock28);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock28);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1d0);
            sock._M_head_impl = _Var16._M_head_impl;
          }
          else {
            bVar7 = i2p::sam::Session::Connect
                              (this_00,(CService *)address._M_pi,&conn,&proxyConnectionFailed);
            if (bVar7) goto LAB_001762f5;
LAB_001763cb:
            _Var16._M_head_impl = (Sock *)0x0;
          }
          i2p::Connection::~Connection(&conn);
        }
        else if (bVar7) {
          bVar7 = ::LogAcceptCategory(PROXY,Debug);
          if (bVar7) {
            Proxy::ToString_abi_cxx11_((string *)&conn,&proxy);
            CService::ToStringAddrPort_abi_cxx11_
                      ((string *)&criticalblock28,(CService *)address._M_pi);
            logging_function_02._M_str = "ConnectNode";
            logging_function_02._M_len = 0xb;
            source_file_02._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
            ;
            source_file_02._M_len = 0x57;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                      (logging_function_02,source_file_02,0x1ec,PROXY,Debug,
                       (ConstevalFormatString<2U>)0x687001,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&conn,
                       (string *)&criticalblock28);
            std::__cxx11::string::~string((string *)&criticalblock28);
            std::__cxx11::string::~string((string *)&conn);
          }
          CNetAddr::ToStringAddr_abi_cxx11_((string *)&conn,(CNetAddr *)address._M_pi);
          uVar8 = CService::GetPort((CService *)address._M_pi);
          ConnectThroughProxy((Proxy *)&criticalblock28,(string *)&proxy,port_00,
                              (bool *)(ulong)uVar8);
          _Var16._M_head_impl = (Sock *)criticalblock28.super_unique_lock._M_device;
          local_220 = (undefined1  [8])criticalblock28.super_unique_lock._M_device;
          criticalblock28.super_unique_lock._M_device = (mutex_type *)0x0;
          std::__cxx11::string::~string((string *)&conn);
          sock._M_head_impl = _Var16._M_head_impl;
        }
        else {
          ConnectDirectly((CService *)&conn,SUB81(address._M_pi,0));
          local_220 = (undefined1  [8])
                      conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                      super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
          _Var16._M_head_impl = (Sock *)conn.sock;
          sock._M_head_impl = (Sock *)conn.sock;
        }
        if (proxyConnectionFailed == false) {
          this_01 = this->addrman;
          tVar9 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                            ();
          AddrMan::Attempt(this_01,(CService *)address._M_pi,SUB41(conn_type,0),
                           (NodeSeconds)tVar9.__d.__r);
        }
LAB_00176403:
        if ((_Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>)_Var16._M_head_impl != (Sock *)0x0
           ) {
          _permission_flags = (CThreadInterrupt *)((ulong)_permission_flags & 0xffffffff00000000);
          pCVar18 = this;
          if (iVar14 == 2) {
            std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::vector
                      ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                       &port,&this->vWhitelistedRangeOutgoing);
          }
          else {
            _port = (pointer)0x0;
            uStack_250 = 0;
            local_248 = (pointer)0x0;
          }
          conn.me.super_CNetAddr.m_net._0_1_ = (undefined1)in_R9D;
          AddWhitelistPermissionFlags
                    (this,&permission_flags,(CNetAddr *)address._M_pi,
                     (vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                     &port);
          LOCK();
          paVar1 = &this->nLastNodeId;
          data = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
          GetDeterministicRandomizer((CSipHasher *)&conn,this,0xd93e69e2bbfa5735);
          this_02 = CSipHasher::Write((CSipHasher *)&conn,data);
          nKeyedNetGroupIn = CSipHasher::Finalize(this_02);
          bVar7 = CNetAddr::IsValid((CNetAddr *)&addr_bind);
          if (!bVar7) {
            GetBindAddress((CAddress *)&conn,sock._M_head_impl);
            CAddress::operator=(&addr_bind,(CAddress *)&conn);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&conn);
          }
          this_03 = (CNode *)operator_new(0x3a8);
          std::__shared_ptr<Sock,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<Sock,std::default_delete<Sock>,void>
                    ((__shared_ptr<Sock,(__gnu_cxx::_Lock_policy)2> *)local_268,
                     (unique_ptr<Sock,_std::default_delete<Sock>_> *)local_220);
          addrIn = (CAddress *)CalculateKeyedNetGroup(pCVar18,(CAddress *)address._M_pi);
          pcVar13 = "";
          if (pszDest_local != (char *)0x0) {
            pcVar13 = pszDest_local;
          }
          node_opts = (CNodeOptions *)0x17654f;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&criticalblock28,pcVar13,(allocator<char> *)&proxyConnectionFailed);
          conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
          super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
          super__Head_base<0UL,_Sock_*,_false>._M_head_impl._0_4_ = permission_flags;
          conn.me.super_CNetAddr.m_addr._union.indirect_contents.indirect =
               (char *)i2p_transient_session._M_t.
                       super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                       .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl;
          i2p_transient_session._M_t.
          super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t.
          super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
          super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
               (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>
                )(__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
          conn.me.super_CNetAddr.m_addr._union.direct[8] = '\0';
          conn.me.super_CNetAddr.m_addr._16_8_ = ZEXT48(pCVar18->nReceiveFloodSize);
          sock_00.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               address._M_pi;
          sock_00.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_268;
          pCVar10 = this_03;
          CNode::CNode(this_03,data,sock_00,addrIn,nKeyedNetGroupIn,(uint64_t)&addr_bind,
                       (CAddress *)&criticalblock28,
                       (string *)CONCAT71(in_register_00000081,use_v2transport),INBOUND,
                       SUB81(&conn,0),node_opts);
          std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
                    ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
                     &conn.me);
          std::__cxx11::string::~string((string *)&criticalblock28);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268 + 8));
          LOCK();
          (this_03->nRefCount).super___atomic_base<int>._M_i =
               (this_03->nRefCount).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          RandAddEvent((uint32_t)data);
          std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::~vector
                    ((vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_> *)
                     &port);
          break;
        }
      }
      else if ((pszDest_local != (char *)0x0) && (bVar7 = GetNameProxy(&proxy), bVar7)) {
        conn.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
        super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
        super__Head_base<0UL,_Sock_*,_false>._M_head_impl =
             (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
             ((long)&conn.me.super_CNetAddr.m_addr._union + 8);
        conn.me.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
        conn.me.super_CNetAddr.m_addr._union.direct[8] = '\0';
        port = portDefault;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&criticalblock28,pszDest_local,(allocator<char> *)&permission_flags);
        in._M_str = (char *)criticalblock28.super_unique_lock._M_device;
        in._M_len = criticalblock28.super_unique_lock._8_8_;
        SplitHostPort(in,&port,(string *)&conn);
        std::__cxx11::string::~string((string *)&criticalblock28);
        ConnectThroughProxy((Proxy *)&criticalblock28,(string *)&proxy,port_00,
                            (bool *)(_port & 0xffff));
        _Var16._M_head_impl = (Sock *)criticalblock28.super_unique_lock._M_device;
        local_220 = (undefined1  [8])criticalblock28.super_unique_lock._M_device;
        std::__cxx11::string::~string((string *)&conn);
        sock._M_head_impl = _Var16._M_head_impl;
        goto LAB_00176403;
      }
    }
    std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
              (&i2p_transient_session);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_bind);
    Proxy::~Proxy(&proxy);
    if (local_220 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_220 + 8))();
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&conn,pcVar13,(allocator<char> *)&addr_bind);
    if (fNameLookup == true) {
      bVar7 = HaveNameProxy();
      bVar7 = !bVar7;
    }
    else {
      bVar7 = false;
    }
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)(local_220 + 8),&g_dns_lookup_abi_cxx11_);
    dns_lookup_function.super__Function_base._M_functor._6_2_ = portDefault;
    dns_lookup_function.super__Function_base._M_functor._0_6_ = in_stack_fffffffffffffd48;
    dns_lookup_function.super__Function_base._M_functor._8_8_ = this;
    dns_lookup_function.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffd58;
    dns_lookup_function._M_invoker._0_4_ = in_stack_fffffffffffffd60;
    dns_lookup_function._M_invoker._4_4_ = in_R9D;
    Lookup((vector<CService,_std::allocator<CService>_> *)&proxy,(string *)&conn,portDefault,bVar7,
           0x100,dns_lookup_function);
    std::_Function_base::~_Function_base((_Function_base *)(local_220 + 8));
    std::__cxx11::string::~string((string *)&conn);
    __last = proxy.proxy.super_CNetAddr.m_addr._union._8_8_;
    uVar15 = proxy.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect;
    if (proxy.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect ==
        (char *)proxy.proxy.super_CNetAddr.m_addr._union._8_8_) {
      std::vector<CAddress,_std::allocator<CAddress>_>::push_back(&local_1f8,(value_type *)pszDest);
LAB_00175f13:
      std::vector<CService,_std::allocator<CService>_>::~vector
                ((vector<CService,_std::allocator<CService>_> *)&proxy);
      goto LAB_00175f20;
    }
    FastRandomContext::FastRandomContext((FastRandomContext *)&conn,false);
    std::
    shuffle<__gnu_cxx::__normal_iterator<CService*,std::vector<CService,std::allocator<CService>>>,FastRandomContext>
              ((__normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>)
               uVar15,(__normal_iterator<CService_*,_std::vector<CService,_std::allocator<CService>_>_>
                       )__last,(FastRandomContext *)&conn);
    ChaCha20::~ChaCha20((ChaCha20 *)((long)&conn.me.super_CNetAddr.m_addr._union + 8));
    mutexIn_00 = &this->m_nodes_mutex;
    uVar15 = proxy.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect;
    do {
      if (uVar15 == proxy.proxy.super_CNetAddr.m_addr._union._8_8_) goto LAB_00175f13;
      MaybeFlipIPv6toCJDNS(&local_e8,(CService *)uVar15);
      ipIn.super_CNetAddr.m_addr._union._6_2_ = portDefault;
      ipIn.super_CNetAddr.m_addr._union._0_6_ = in_stack_fffffffffffffd48;
      ipIn.super_CNetAddr.m_addr._union._8_8_ = this;
      ipIn.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffffd58;
      ipIn.super_CNetAddr.m_net = in_stack_fffffffffffffd60;
      ipIn.super_CNetAddr.m_scope_id = in_R9D;
      ipIn._32_8_ = in_stack_fffffffffffffd68;
      CAddress::CAddress((CAddress *)&conn,ipIn,(ServiceFlags)&local_e8);
      CAddress::operator=((CAddress *)pszDest,(CAddress *)&conn);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&conn);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_e8);
      bVar7 = CNetAddr::IsValid((CNetAddr *)pszDest);
      if (!bVar7) {
        bVar7 = ::LogAcceptCategory(NET,Debug);
        if (bVar7) {
          CService::ToStringAddrPort_abi_cxx11_((string *)&conn,(CService *)pszDest);
          logging_function_03._M_str = "ConnectNode";
          logging_function_03._M_len = 0xb;
          source_file_03._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
          ;
          source_file_03._M_len = 0x57;
          LogPrintFormatInternal<std::__cxx11::string,char_const*>
                    (logging_function_03,source_file_03,0x1aa,NET,Debug,
                     (ConstevalFormatString<2U>)0x686f86,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&conn,
                     &pszDest_local);
          std::__cxx11::string::~string((string *)&conn);
        }
        break;
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&addr_bind,mutexIn_00,
                 "m_nodes_mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                 ,0x1af,false);
      CService::CService((CService *)&conn,(CService *)pszDest);
      pCVar10 = FindNode(this,(CService *)&conn);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&conn);
      if (pCVar10 == (CNode *)0x0) {
        std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                  (&local_1f8,(value_type *)pszDest);
      }
      else {
        CService::ToStringAddrPort_abi_cxx11_((string *)&conn,(CService *)pszDest);
        logging_function_01._M_str = "ConnectNode";
        logging_function_01._M_len = 0xb;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
        ;
        source_file_01._M_len = 0x57;
        LogPrintFormatInternal<char_const*,std::__cxx11::string>
                  (logging_function_01,source_file_01,0x1b2,ALL,Info,
                   (ConstevalFormatString<2U>)0x686fb3,&pszDest_local,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&conn);
        std::__cxx11::string::~string((string *)&conn);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&addr_bind);
      uVar15 = uVar15 + 0x28;
    } while (pCVar10 == (CNode *)0x0);
    std::vector<CService,_std::allocator<CService>_>::~vector
              ((vector<CService,_std::allocator<CService>_> *)&proxy);
    pCVar10 = (CNode *)0x0;
  }
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_1f8);
LAB_001766e9:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return pCVar10;
}

Assistant:

CNode* CConnman::ConnectNode(CAddress addrConnect, const char *pszDest, bool fCountFailure, ConnectionType conn_type, bool use_v2transport)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    assert(conn_type != ConnectionType::INBOUND);

    if (pszDest == nullptr) {
        if (IsLocal(addrConnect))
            return nullptr;

        // Look for an existing connection
        CNode* pnode = FindNode(static_cast<CService>(addrConnect));
        if (pnode)
        {
            LogPrintf("Failed to open new connection, already connected\n");
            return nullptr;
        }
    }

    LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "trying %s connection %s lastseen=%.1fhrs\n",
        use_v2transport ? "v2" : "v1",
        pszDest ? pszDest : addrConnect.ToStringAddrPort(),
        Ticks<HoursDouble>(pszDest ? 0h : Now<NodeSeconds>() - addrConnect.nTime));

    // Resolve
    const uint16_t default_port{pszDest != nullptr ? GetDefaultPort(pszDest) :
                                                     m_params.GetDefaultPort()};

    // Collection of addresses to try to connect to: either all dns resolved addresses if a domain name (pszDest) is provided, or addrConnect otherwise.
    std::vector<CAddress> connect_to{};
    if (pszDest) {
        std::vector<CService> resolved{Lookup(pszDest, default_port, fNameLookup && !HaveNameProxy(), 256)};
        if (!resolved.empty()) {
            std::shuffle(resolved.begin(), resolved.end(), FastRandomContext());
            // If the connection is made by name, it can be the case that the name resolves to more than one address.
            // We don't want to connect any more of them if we are already connected to one
            for (const auto& r : resolved) {
                addrConnect = CAddress{MaybeFlipIPv6toCJDNS(r), NODE_NONE};
                if (!addrConnect.IsValid()) {
                    LogDebug(BCLog::NET, "Resolver returned invalid address %s for %s\n", addrConnect.ToStringAddrPort(), pszDest);
                    return nullptr;
                }
                // It is possible that we already have a connection to the IP/port pszDest resolved to.
                // In that case, drop the connection that was just created.
                LOCK(m_nodes_mutex);
                CNode* pnode = FindNode(static_cast<CService>(addrConnect));
                if (pnode) {
                    LogPrintf("Not opening a connection to %s, already connected to %s\n", pszDest, addrConnect.ToStringAddrPort());
                    return nullptr;
                }
                // Add the address to the resolved addresses vector so we can try to connect to it later on
                connect_to.push_back(addrConnect);
            }
        } else {
            // For resolution via proxy
            connect_to.push_back(addrConnect);
        }
    } else {
        // Connect via addrConnect directly
        connect_to.push_back(addrConnect);
    }

    // Connect
    std::unique_ptr<Sock> sock;
    Proxy proxy;
    CAddress addr_bind;
    assert(!addr_bind.IsValid());
    std::unique_ptr<i2p::sam::Session> i2p_transient_session;

    for (auto& target_addr: connect_to) {
        if (target_addr.IsValid()) {
            const bool use_proxy{GetProxy(target_addr.GetNetwork(), proxy)};
            bool proxyConnectionFailed = false;

            if (target_addr.IsI2P() && use_proxy) {
                i2p::Connection conn;
                bool connected{false};

                if (m_i2p_sam_session) {
                    connected = m_i2p_sam_session->Connect(target_addr, conn, proxyConnectionFailed);
                } else {
                    {
                        LOCK(m_unused_i2p_sessions_mutex);
                        if (m_unused_i2p_sessions.empty()) {
                            i2p_transient_session =
                                std::make_unique<i2p::sam::Session>(proxy, &interruptNet);
                        } else {
                            i2p_transient_session.swap(m_unused_i2p_sessions.front());
                            m_unused_i2p_sessions.pop();
                        }
                    }
                    connected = i2p_transient_session->Connect(target_addr, conn, proxyConnectionFailed);
                    if (!connected) {
                        LOCK(m_unused_i2p_sessions_mutex);
                        if (m_unused_i2p_sessions.size() < MAX_UNUSED_I2P_SESSIONS_SIZE) {
                            m_unused_i2p_sessions.emplace(i2p_transient_session.release());
                        }
                    }
                }

                if (connected) {
                    sock = std::move(conn.sock);
                    addr_bind = CAddress{conn.me, NODE_NONE};
                }
            } else if (use_proxy) {
                LogPrintLevel(BCLog::PROXY, BCLog::Level::Debug, "Using proxy: %s to connect to %s\n", proxy.ToString(), target_addr.ToStringAddrPort());
                sock = ConnectThroughProxy(proxy, target_addr.ToStringAddr(), target_addr.GetPort(), proxyConnectionFailed);
            } else {
                // no proxy needed (none set for target network)
                sock = ConnectDirectly(target_addr, conn_type == ConnectionType::MANUAL);
            }
            if (!proxyConnectionFailed) {
                // If a connection to the node was attempted, and failure (if any) is not caused by a problem connecting to
                // the proxy, mark this as an attempt.
                addrman.Attempt(target_addr, fCountFailure);
            }
        } else if (pszDest && GetNameProxy(proxy)) {
            std::string host;
            uint16_t port{default_port};
            SplitHostPort(std::string(pszDest), port, host);
            bool proxyConnectionFailed;
            sock = ConnectThroughProxy(proxy, host, port, proxyConnectionFailed);
        }
        // Check any other resolved address (if any) if we fail to connect
        if (!sock) {
            continue;
        }

        NetPermissionFlags permission_flags = NetPermissionFlags::None;
        std::vector<NetWhitelistPermissions> whitelist_permissions = conn_type == ConnectionType::MANUAL ? vWhitelistedRangeOutgoing : std::vector<NetWhitelistPermissions>{};
        AddWhitelistPermissionFlags(permission_flags, target_addr, whitelist_permissions);

        // Add node
        NodeId id = GetNewNodeId();
        uint64_t nonce = GetDeterministicRandomizer(RANDOMIZER_ID_LOCALHOSTNONCE).Write(id).Finalize();
        if (!addr_bind.IsValid()) {
            addr_bind = GetBindAddress(*sock);
        }
        CNode* pnode = new CNode(id,
                                std::move(sock),
                                target_addr,
                                CalculateKeyedNetGroup(target_addr),
                                nonce,
                                addr_bind,
                                pszDest ? pszDest : "",
                                conn_type,
                                /*inbound_onion=*/false,
                                CNodeOptions{
                                    .permission_flags = permission_flags,
                                    .i2p_sam_session = std::move(i2p_transient_session),
                                    .recv_flood_size = nReceiveFloodSize,
                                    .use_v2transport = use_v2transport,
                                });
        pnode->AddRef();

        // We're making a new connection, harvest entropy from the time (and our peer count)
        RandAddEvent((uint32_t)id);

        return pnode;
    }

    return nullptr;
}